

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info_test_helper.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::testing::TypeInfoTestHelper::ResetTypeInfo
          (TypeInfoTestHelper *this,
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *descriptors)

{
  DescriptorPool *pool;
  long *plVar1;
  TypeInfoTestHelper *pTVar2;
  LogMessage *pLVar3;
  pointer ppDVar4;
  TypeResolver *pTVar5;
  TypeInfo *pTVar6;
  int i;
  ulong uVar7;
  LogMessage local_78;
  TypeInfoTestHelper *local_40;
  LogFinisher local_31;
  
  if (*(int *)this == 0) {
    ppDVar4 = (descriptors->
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pool = *(DescriptorPool **)(*(long *)(*ppDVar4 + 0x10) + 0x10);
    local_40 = this;
    for (uVar7 = 1;
        uVar7 < (ulong)((long)(descriptors->
                              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
        uVar7 = uVar7 + 1) {
      if (pool != *(DescriptorPool **)(*(long *)(ppDVar4[uVar7] + 0x10) + 0x10)) {
        protobuf::internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
                   ,0x3c);
        pLVar3 = protobuf::internal::LogMessage::operator<<
                           (&local_78,"CHECK failed: pool == descriptors[i]->file()->pool(): ");
        pLVar3 = protobuf::internal::LogMessage::operator<<
                           (pLVar3,"Descriptors from different pools are not supported.");
        protobuf::internal::LogFinisher::operator=(&local_31,pLVar3);
        protobuf::internal::LogMessage::~LogMessage(&local_78);
        ppDVar4 = (descriptors->
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::__cxx11::string::string((string *)&local_78,"type.googleapis.com",(allocator *)&local_31);
    pTVar5 = NewTypeResolverForDescriptorPool((string *)&local_78,pool);
    pTVar2 = local_40;
    plVar1 = *(long **)(local_40 + 0x10);
    *(TypeResolver **)(local_40 + 0x10) = pTVar5;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    std::__cxx11::string::~string((string *)&local_78);
    pTVar6 = TypeInfo::NewTypeInfo(*(TypeResolver **)(pTVar2 + 0x10));
    plVar1 = *(long **)(pTVar2 + 8);
    *(TypeInfo **)(pTVar2 + 8) = pTVar6;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  else {
    protobuf::internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
               ,0x45);
    pLVar3 = protobuf::internal::LogMessage::operator<<(&local_78,"Can not reach here.");
    protobuf::internal::LogFinisher::operator=(&local_31,pLVar3);
    protobuf::internal::LogMessage::~LogMessage(&local_78);
  }
  return;
}

Assistant:

void TypeInfoTestHelper::ResetTypeInfo(
    const std::vector<const Descriptor*>& descriptors) {
  switch (type_) {
    case USE_TYPE_RESOLVER: {
      const DescriptorPool* pool = descriptors[0]->file()->pool();
      for (int i = 1; i < descriptors.size(); ++i) {
        GOOGLE_CHECK(pool == descriptors[i]->file()->pool())
            << "Descriptors from different pools are not supported.";
      }
      type_resolver_.reset(
          NewTypeResolverForDescriptorPool(kTypeServiceBaseUrl, pool));
      typeinfo_.reset(TypeInfo::NewTypeInfo(type_resolver_.get()));
      return;
    }
  }
  GOOGLE_LOG(FATAL) << "Can not reach here.";
}